

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O2

void __thiscall Constant::jumping(Constant *this,int t,int f)

{
  ostream *poVar1;
  string *s;
  stringstream ss;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  if ((t == 0) || (True.super___shared_ptr<Constant,_(__gnu_cxx::_Lock_policy)2>._M_ptr != this)) {
    if ((f == 0) || (False.super___shared_ptr<Constant,_(__gnu_cxx::_Lock_policy)2>._M_ptr != this))
    goto LAB_0010f3ad;
    poVar1 = std::operator<<(local_190,"goto L");
    std::ostream::operator<<(poVar1,f);
    s = &local_1e0;
    std::__cxx11::stringbuf::str();
    Node::emit((Node *)this,s);
  }
  else {
    poVar1 = std::operator<<(local_190,"goto L");
    std::ostream::operator<<(poVar1,t);
    s = &local_1c0;
    std::__cxx11::stringbuf::str();
    Node::emit((Node *)this,s);
  }
  std::__cxx11::string::~string((string *)s);
LAB_0010f3ad:
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void jumping(int t, int f) override {
		std::stringstream ss;
		if (this == True.get() && t != 0) {
			ss << "goto L" << t;
			emit(ss.str());
		}
		else if (this == False.get() && f != 0) {
			ss << "goto L" << f;
			emit(ss.str());
		}
	}